

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O1

void __thiscall wasm::ReFinalize::visitBlock(ReFinalize *this,Block *curr)

{
  char *__code;
  size_t sVar1;
  Expression **ppEVar2;
  uintptr_t uVar3;
  __node_base_ptr p_Var4;
  Type TVar5;
  size_t sVar6;
  __hashtable *__h;
  _Hash_node_base *p_Var7;
  __node_gen_type __node_gen;
  
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0) {
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  }
  else {
    __code = (curr->name).super_IString.str._M_str;
    if (__code != (char *)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
      p_Var4 = std::
               _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&(this->breakTypes)._M_h,
                          (ulong)__code % (this->breakTypes)._M_h._M_bucket_count,&curr->name,
                          (__hash_code)__code);
      if (p_Var4 != (__node_base_ptr)0x0) {
        p_Var7 = p_Var4->_M_nxt;
      }
      if (p_Var7 != (_Hash_node_base *)0x0) {
        sVar1 = (curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if (sVar1 == 0) goto LAB_00729abf;
        std::
        _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Type_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Type,true>>>>
                  ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)(p_Var7 + 3),
                   &(curr->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                    [sVar1 - 1]->type);
        TVar5 = wasm::Type::
                getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                          ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                            *)(p_Var7 + 3));
        (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
             TVar5.id;
        if (p_Var7 != (_Hash_node_base *)0x0) {
          return;
        }
      }
    }
    sVar1 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements;
    if (sVar1 == 0) {
LAB_00729abf:
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    ppEVar2 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    uVar3 = (ppEVar2[sVar1 - 1]->type).id;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = uVar3;
    if (uVar3 == 0) {
      sVar6 = 0;
      do {
        if ((ppEVar2[sVar6]->type).id == 1) {
          (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
          return;
        }
        sVar6 = sVar6 + 1;
      } while (sVar1 != sVar6);
    }
  }
  return;
}

Assistant:

void ReFinalize::visitBlock(Block* curr) {
  if (curr->list.size() == 0) {
    curr->type = Type::none;
    return;
  }
  if (curr->name.is()) {
    auto iter = breakTypes.find(curr->name);
    if (iter != breakTypes.end()) {
      // Set the type to be a supertype of the branch types and the flowed-out
      // type. TODO: calculate proper LUBs to compute a new correct type in this
      // situation.
      auto& types = iter->second;
      types.insert(curr->list.back()->type);
      curr->type = Type::getLeastUpperBound(types);
      return;
    }
  }
  curr->type = curr->list.back()->type;
  if (curr->type == Type::unreachable) {
    return;
  }
  // type is none, but we might be unreachable
  if (curr->type == Type::none) {
    for (auto* child : curr->list) {
      if (child->type == Type::unreachable) {
        curr->type = Type::unreachable;
        break;
      }
    }
  }
}